

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcrepo_value.cpp
# Opt level: O0

value_ptr __thiscall
pstore::dump::make_value
          (dump *this,shared_ptr<const_pstore::repo::compilation> *compilation,parameters *parm)

{
  element_type *__buf;
  initializer_list<pstore::dump::object::member> __l;
  size_type sVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar3;
  member *local_1f8;
  allocator<pstore::dump::object::member> local_19a;
  undefined1 local_199;
  address local_198;
  indirect_string local_190;
  value_ptr local_178;
  allocator local_161;
  string local_160 [32];
  value_ptr local_140;
  allocator local_129;
  string local_128 [32];
  member *local_108;
  member local_100;
  member local_d0;
  iterator local_a0;
  size_type local_98;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_90;
  shared_ptr<pstore::dump::value> local_78;
  const_iterator local_68;
  definition *member;
  const_iterator __end2;
  const_iterator __begin2;
  element_type *__range2;
  undefined1 local_38 [8];
  container members;
  parameters *parm_local;
  shared_ptr<const_pstore::repo::compilation> *compilation_local;
  
  members.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)parm;
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
            *)local_38);
  peVar2 = std::
           __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)compilation);
  sVar1 = repo::compilation::size(peVar2);
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::reserve((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             *)local_38,(ulong)sVar1);
  __begin2 = (const_iterator)
             std::
             __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)compilation);
  __end2 = repo::compilation::begin((compilation *)__begin2);
  member = repo::compilation::end((compilation *)__begin2);
  for (; __end2 != member; __end2 = __end2 + 1) {
    local_68 = __end2;
    make_value((dump *)&local_78,__end2,
               (parameters *)
               members.
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
    ::emplace_back<std::shared_ptr<pstore::dump::value>>
              ((vector<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
                *)local_38,&local_78);
    std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_78);
  }
  local_199 = 1;
  local_108 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"members",&local_129);
  make_value((dump *)&local_140,(container *)local_38);
  object::member::member(&local_100,(string *)local_128,&local_140);
  local_108 = &local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"triple",&local_161);
  __buf = ((members.
            super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
          super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = std::
           __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)compilation);
  local_198.a_ = (value_type)repo::compilation::triple(peVar2);
  indirect_string::read((int)&local_190,__buf,local_198.a_);
  make_value((dump *)&local_178,&local_190);
  object::member::member(&local_d0,(string *)local_160,&local_178);
  local_199 = 0;
  local_a0 = &local_100;
  local_98 = 2;
  std::allocator<pstore::dump::object::member>::allocator(&local_19a);
  __l._M_len = local_98;
  __l._M_array = local_a0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_90,__l,&local_19a);
  make_value(this,&local_90);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_90);
  std::allocator<pstore::dump::object::member>::~allocator(&local_19a);
  local_1f8 = (member *)&local_a0;
  do {
    local_1f8 = local_1f8 + -1;
    object::member::~member(local_1f8);
  } while (local_1f8 != &local_100);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_178);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_140);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             *)local_38);
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (std::shared_ptr<repo::compilation const> const & compilation,
                              parameters const & parm) {
            array::container members;
            members.reserve (compilation->size ());
            for (auto const & member : *compilation) {
                members.emplace_back (make_value (member, parm));
            }

            using namespace serialize;
            using archive::make_reader;
            return make_value (object::container{
                {"members", make_value (members)},
                {"triple", make_value (indirect_string::read (parm.db, compilation->triple ()))},
            });
        }